

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O3

void __thiscall TApp_BasicSubcommands_Test::TestBody(TApp_BasicSubcommands_Test *this)

{
  App *this_00;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__x;
  input_t *piVar1;
  pointer *pppAVar2;
  bool bVar3;
  App *pAVar4;
  App *pAVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  App *sub1;
  App *sub2;
  AssertHelper local_1b8 [2];
  AssertHelper local_1a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0 [3];
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_188;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  unsigned_long local_148;
  App *local_140;
  App *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90 [3];
  
  local_90[0]._M_dataplus._M_p = (pointer)&local_90[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"sub1","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  this_00 = &(this->super_TApp).app;
  pAVar4 = CLI::App::add_subcommand(this_00,local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90[0]._M_dataplus._M_p != &local_90[0].field_2) {
    operator_delete(local_90[0]._M_dataplus._M_p);
  }
  local_140 = pAVar4;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"sub2","");
  pAVar4 = (App *)0x15b2ac;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"","");
  pAVar5 = CLI::App::add_subcommand(this_00,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_1a8.data_ = (AssertHelperData *)local_140->parent_;
  local_1b8[0].data_ = (AssertHelperData *)this_00;
  local_138 = pAVar5;
  testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
            ((internal *)&local_188,"sub1->get_parent()","&app",(App **)&local_1a8,(App **)local_1b8
            );
  if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      pAVar4 = *local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0xf,(char *)pAVar4);
    testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    if ((App *)local_1a8.data_ != (App *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((App *)local_1a8.data_ != (App *)0x0)) {
        (**(code **)(*(long *)local_1a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8.data_ = (AssertHelperData *)CLI::App::get_subcommand(this_00,local_140);
  testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
            ((internal *)&local_188,"sub1","app.get_subcommand(sub1)",&local_140,(App **)&local_1a8)
  ;
  if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pAVar4 = (App *)0x15b2ac;
    }
    else {
      pAVar4 = *local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x11,(char *)pAVar4);
    testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    if ((App *)local_1a8.data_ != (App *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((App *)local_1a8.data_ != (App *)0x0)) {
        (**(code **)(*(long *)local_1a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"sub1","");
  local_1a8.data_ = (AssertHelperData *)CLI::App::get_subcommand(this_00,&local_110);
  testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
            ((internal *)&local_188,"sub1","app.get_subcommand(\"sub1\")",&local_140,
             (App **)&local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1a8);
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pAVar4 = (App *)0x15b2ac;
    }
    else {
      pAVar4 = *local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x12,(char *)pAVar4);
    testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    if ((App *)local_1a8.data_ != (App *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((App *)local_1a8.data_ != (App *)0x0)) {
        (**(code **)(*(long *)local_1a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"sub3","");
    CLI::App::get_subcommand(this_00,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_188);
  testing::internal::AssertHelper::AssertHelper
            (&local_1a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x13,
             "Expected: app.get_subcommand(\"sub3\") throws an exception of type CLI::OptionNotFound.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
  testing::internal::AssertHelper::~AssertHelper(&local_1a8);
  if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      (*(code *)((*local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                   super__Vector_impl_data._M_start)->name_)._M_dataplus._M_p)();
    }
  }
  TApp::run(&this->super_TApp);
  local_1b8[0].data_ = (AssertHelperData *)0x0;
  __x = &(this->super_TApp).app.parsed_subcommands_;
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_188,__x);
  local_148 = (long)local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_1a8,"(size_t)0","app.get_subcommands().size()",
             (unsigned_long *)local_1b8,&local_148);
  if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_1a0[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1a0[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x16,pcVar7);
    testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0)) {
        (*(code *)((*local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                     super__Vector_impl_data._M_start)->name_)._M_dataplus._M_p)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  pppAVar2 = &local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppAVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"sub1","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_188,
             local_168);
  if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppAVar2) {
    operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  TApp::run(&this->super_TApp);
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_188,__x);
  if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
              ((internal *)&local_1a8,"sub1","app.get_subcommands().at(0)",&local_140,
               local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1a8.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_188);
      if (local_1a0[0].ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_1a0[0].ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x1b,pcVar7);
      testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper(local_1b8);
      if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          (*(code *)*(pointer)((long)*local_188.
                                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CLI::App::reset(this_00);
    local_1b8[0].data_ = (AssertHelperData *)0x0;
    CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_188,__x);
    local_148 = (long)local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_1a8,"(size_t)0","app.get_subcommands().size()",
               (unsigned_long *)local_1b8,&local_148);
    pppAVar2 = &local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1a8.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_188);
      if (local_1a0[0].ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_1a0[0].ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x1e,pcVar7);
      testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper(local_1b8);
      if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          (*(code *)*(pointer)((long)*local_188.
                                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppAVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"sub2","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,
               &local_188,local_168);
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppAVar2) {
      operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    TApp::run(&this->super_TApp);
    local_1b8[0].data_ = (AssertHelperData *)0x1;
    CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_188,__x);
    local_148 = (long)local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_1a8,"(size_t)1","app.get_subcommands().size()",
               (unsigned_long *)local_1b8,&local_148);
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pppAVar2 = &local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (local_1a8.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_188);
      if (local_1a0[0].ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((local_1a0[0].ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x22,pcVar7);
      testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper(local_1b8);
      if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          (*(code *)*(pointer)((long)*local_188.
                                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_188,__x);
    if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      testing::internal::CmpHelperEQ<CLI::App*,CLI::App*>
                ((internal *)&local_1a8,"sub2","app.get_subcommands().at(0)",&local_138,
                 local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1a8.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_188);
        if (local_1a0[0].ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((local_1a0[0].ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                   ,0x23,pcVar7);
        testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_188);
        testing::internal::AssertHelper::~AssertHelper(local_1b8);
        if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0)) {
            (*(code *)*(pointer)((long)*local_188.
                                        super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(local_1a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CLI::App::reset(this_00);
      local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pppAVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"SUb2","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,
                 &local_188,local_168);
      if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)pppAVar2) {
        operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        TApp::run(&this->super_TApp);
      }
      testing::Message::Message((Message *)&local_188);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
                 ,0x27,
                 "Expected: run() throws an exception of type CLI::ExtrasError.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_188);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0)) {
          (*(code *)*(pointer)((long)*local_188.
                                      super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      CLI::App::reset(this_00);
      local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pppAVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"SUb2","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,
                 &local_188,local_168);
      if (local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)pppAVar2) {
        operator_delete(local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      TApp::run(&this->super_TApp);
      CLI::App::reset(this_00);
      local_188.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pppAVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"sub1","");
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"extra","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,
                 &local_188,&local_148);
      lVar8 = 0;
      do {
        if (local_158 + lVar8 != *(undefined1 **)((long)local_168 + lVar8)) {
          operator_delete(*(undefined1 **)((long)local_168 + lVar8));
        }
        lVar8 = lVar8 + -0x20;
      } while (lVar8 != -0x40);
      TApp::run(&this->super_TApp);
      return;
    }
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  __clang_call_terminate(uVar6);
}

Assistant:

TEST_F(TApp, BasicSubcommands) {
    auto sub1 = app.add_subcommand("sub1");
    auto sub2 = app.add_subcommand("sub2");

    EXPECT_EQ(sub1->get_parent(), &app);

    EXPECT_EQ(sub1, app.get_subcommand(sub1));
    EXPECT_EQ(sub1, app.get_subcommand("sub1"));
    EXPECT_THROW(app.get_subcommand("sub3"), CLI::OptionNotFound);

    run();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    app.reset();
    args = {"sub1"};
    run();
    EXPECT_EQ(sub1, app.get_subcommands().at(0));

    app.reset();
    EXPECT_EQ((size_t)0, app.get_subcommands().size());

    args = {"sub2"};
    run();
    EXPECT_EQ((size_t)1, app.get_subcommands().size());
    EXPECT_EQ(sub2, app.get_subcommands().at(0));

    app.reset();
    args = {"SUb2"};
    EXPECT_THROW(run(), CLI::ExtrasError);

    app.reset();
    args = {"SUb2"};
    try {
        run();
    } catch(const CLI::ExtrasError &e) {
        EXPECT_THAT(e.what(), HasSubstr("SUb2"));
    }

    app.reset();
    args = {"sub1", "extra"};
    try {
        run();
    } catch(const CLI::ExtrasError &e) {
        EXPECT_THAT(e.what(), HasSubstr("extra"));
    }
}